

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::PathBuilderKeyRolloverTest_TestDuplicateIntermediates_Test::TestBody
          (PathBuilderKeyRolloverTest_TestDuplicateIntermediates_Test *this)

{
  shared_ptr<const_bssl::ParsedCertificate> *lhs;
  shared_ptr<const_bssl::ParsedCertificate> *lhs_00;
  element_type *peVar1;
  CertPathBuilderResultPath *pCVar2;
  long lVar3;
  bool bVar4;
  StatusCode SVar5;
  string *psVar6;
  char *pcVar7;
  char *pcVar8;
  pointer *__ptr;
  pointer *__ptr_1;
  undefined1 local_310 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_308;
  Input local_300;
  AssertHelper local_2f0;
  VerifyError error;
  __uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> local_2b8;
  shared_ptr<const_bssl::ParsedCertificate> local_2b0;
  shared_ptr<const_bssl::ParsedCertificate> local_2a0;
  shared_ptr<const_bssl::ParsedCertificate> local_290;
  shared_ptr<const_bssl::ParsedCertificate> local_280;
  shared_ptr<const_bssl::ParsedCertificate> local_270;
  shared_ptr<const_bssl::ParsedCertificate> oldintermediate_dupe;
  Result result;
  CertIssuerSourceStatic sync_certs2;
  CertIssuerSourceStatic sync_certs1;
  AsyncCertIssuerSourceStatic async_certs;
  CertPathBuilder path_builder;
  TrustStoreInMemory trust_store;
  
  peVar1 = (this->super_PathBuilderKeyRolloverTest).oldintermediate_.
           super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2b8._M_t.super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       CRYPTO_BUFFER_new((peVar1->cert_).data_.data_,(peVar1->cert_).data_.size_,
                         (CRYPTO_BUFFER_POOL *)0x0);
  path_builder.out_result_.paths.
  super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  ParsedCertificate::Create
            ((ParsedCertificate *)&oldintermediate_dupe,(UniquePtr<CRYPTO_BUFFER> *)&local_2b8,
             (ParseCertificateOptions *)&path_builder,(CertErrors *)0x0);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_2b8);
  TrustStoreInMemory::TrustStoreInMemory(&trust_store);
  local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).newroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).newroot_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  TrustStoreInMemory::AddTrustAnchor(&trust_store,&local_270);
  if (local_270.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  CertIssuerSourceStatic::CertIssuerSourceStatic(&sync_certs1);
  local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).oldintermediate_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).oldintermediate_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CertIssuerSourceStatic::AddCert(&sync_certs1,&local_280);
  if (local_280.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  CertIssuerSourceStatic::CertIssuerSourceStatic(&sync_certs2);
  local_290.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       oldintermediate_dupe.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_290.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       oldintermediate_dupe.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (oldintermediate_dupe.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (oldintermediate_dupe.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (oldintermediate_dupe.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (oldintermediate_dupe.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (oldintermediate_dupe.
            super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CertIssuerSourceStatic::AddCert(&sync_certs2,&local_290);
  if (local_290.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  async_certs.super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__AsyncCertIssuerSourceStatic_006c0b70;
  CertIssuerSourceStatic::CertIssuerSourceStatic(&async_certs.static_cert_issuer_source_);
  async_certs.num_async_gets_ = 0;
  async_certs.async_get_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  async_certs.async_get_callback_.super__Function_base._M_functor._8_8_ = 0;
  async_certs.async_get_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  async_certs.async_get_callback_._M_invoker = (_Invoker_type)0x0;
  local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).newintermediate_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).newintermediate_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  AsyncCertIssuerSourceStatic::AddCert(&async_certs,&local_2a0);
  if (local_2a0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a0.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_PathBuilderKeyRolloverTest).target_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_PathBuilderKeyRolloverTest).target_.
       super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pcVar8 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            (&path_builder,&local_2b0,&trust_store.super_TrustStore,
             &(this->super_PathBuilderKeyRolloverTest).delegate_.super_CertPathBuilderDelegate,
             &(this->super_PathBuilderKeyRolloverTest).time_,ANY_EKU,
             (this->super_PathBuilderKeyRolloverTest).initial_explicit_policy_,
             &(this->super_PathBuilderKeyRolloverTest).user_initial_policy_set_,
             (this->super_PathBuilderKeyRolloverTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderKeyRolloverTest).initial_any_policy_inhibit_);
  if (local_2b0.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  CertPathBuilder::AddCertIssuerSource(&path_builder,&sync_certs1.super_CertIssuerSource);
  CertPathBuilder::AddCertIssuerSource(&path_builder,&sync_certs2.super_CertIssuerSource);
  CertPathBuilder::AddCertIssuerSource(&path_builder,&async_certs.super_CertIssuerSource);
  CertPathBuilder::Run(&result,&path_builder);
  bVar4 = CertPathBuilder::Result::HasValidPath(&result);
  local_310[0] = (internal)bVar4;
  pbStack_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)local_310,(AssertionResult *)"result.HasValidPath()",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x6d3,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((string *)CONCAT71(error.offset_._1_7_,(char)error.offset_) != &error.diagnostic_) {
      operator_delete((undefined1 *)CONCAT71(error.offset_._1_7_,(char)error.offset_),
                      (ulong)(error.diagnostic_._M_dataplus._M_p + 1));
    }
    if ((long *)local_300.data_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_300.data_.data_ + 8))();
    }
    if (pbStack_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_308,pbStack_308);
    }
  }
  local_300.data_.data_ = (uchar *)CONCAT44(local_300.data_.data_._4_4_,2);
  local_310 = (undefined1  [8])
              ((long)result.paths.
                     super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)result.paths.
                     super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&error,"2U","result.paths.size()",(uint *)&local_300,
             (unsigned_long *)local_310);
  if ((char)error.offset_ == '\0') {
    testing::Message::Message((Message *)local_310);
    if (error._8_8_ == 0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)error._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x6d4,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_310);
  }
  else {
    if (error._8_8_ != 0) {
      ::std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&error.code_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error._8_8_)
      ;
    }
    bVar4 = CertPathBuilderResultPath::IsValid
                      (((result.paths.
                         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl
                      );
    local_310[0] = (internal)!bVar4;
    pbStack_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar4) {
      testing::Message::Message((Message *)&local_300);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&error,(internal *)local_310,
                 (AssertionResult *)"result.paths[0]->IsValid()","true","false",pcVar8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6d8,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
      testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_2f0);
      if ((string *)CONCAT71(error.offset_._1_7_,(char)error.offset_) != &error.diagnostic_) {
        operator_delete((undefined1 *)CONCAT71(error.offset_._1_7_,(char)error.offset_),
                        (ulong)(error.diagnostic_._M_dataplus._M_p + 1));
      }
      if ((long *)local_300.data_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_300.data_.data_ + 8))();
      }
      if (pbStack_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_308,pbStack_308);
      }
    }
    pCVar2 = ((result.paths.
               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ._M_t.
             super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
    local_300.data_.data_ = (uchar *)CONCAT44(local_300.data_.data_._4_4_,3);
    local_310 = (undefined1  [8])
                ((long)*(pointer *)
                        ((long)&(pCVar2->certs).
                                super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                        + 8) -
                 *(long *)&(pCVar2->certs).
                           super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                >> 4);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&error,"3U","path0.certs.size()",(uint *)&local_300,
               (unsigned_long *)local_310);
    if ((char)error.offset_ == '\0') {
      testing::Message::Message((Message *)local_310);
      if (error._8_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)error._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_300,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6db,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_310);
    }
    else {
      lhs = &(this->super_PathBuilderKeyRolloverTest).target_;
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"target_","path0.certs[0]",lhs,
                 *(shared_ptr<const_bssl::ParsedCertificate> **)
                  &(pCVar2->certs).
                   super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                );
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)local_310);
        if (error._8_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6dc,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_310);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
        if (local_310 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_310 + 8))();
        }
      }
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      peVar1 = (this->super_PathBuilderKeyRolloverTest).oldintermediate_.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_310 = (undefined1  [8])(peVar1->cert_).data_.data_;
      pbStack_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (peVar1->cert_).data_.size_;
      lVar3 = *(long *)(*(long *)&(pCVar2->certs).
                                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       + 0x10);
      local_300.data_.data_ = *(uchar **)(lVar3 + 8);
      local_300.data_.size_ = *(size_t *)(lVar3 + 0x10);
      testing::internal::CmpHelperEQ<bssl::der::Input,bssl::der::Input>
                ((internal *)&error,"oldintermediate_->der_cert()","path0.certs[1]->der_cert()",
                 (Input *)local_310,&local_300);
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)local_310);
        if (error._8_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6df,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_310);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
        if (local_310 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_310 + 8))();
        }
      }
      lhs_00 = &(this->super_PathBuilderKeyRolloverTest).newroot_;
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      testing::internal::
      CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                ((internal *)&error,"newroot_","path0.certs[2]",lhs_00,
                 (shared_ptr<const_bssl::ParsedCertificate> *)
                 (*(long *)&(pCVar2->certs).
                            super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                 + 0x20));
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)local_310);
        if (error._8_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e0,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_310);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )local_310 !=
            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)local_310 + 8))();
        }
      }
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      local_310._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&error,"1U","result.best_result_index",(uint *)local_310,
                 &result.best_result_index);
      if ((char)error.offset_ == '\0') {
        testing::Message::Message((Message *)local_310);
        if (error._8_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)error._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e4,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_310);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
        if (local_310 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_310 + 8))();
        }
      }
      if (error._8_8_ != 0) {
        ::std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&error.code_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     error._8_8_);
      }
      bVar4 = CertPathBuilderResultPath::IsValid
                        (result.paths.
                         super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                         super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                         .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                         _M_head_impl);
      local_310[0] = (internal)bVar4;
      pbStack_308 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar4) {
        testing::Message::Message((Message *)&local_300);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&error,(internal *)local_310,
                   (AssertionResult *)"result.paths[1]->IsValid()","false","true",pcVar8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                   ,0x6e5,(char *)CONCAT71(error.offset_._1_7_,(char)error.offset_));
        testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
        testing::internal::AssertHelper::~AssertHelper(&local_2f0);
        if ((string *)CONCAT71(error.offset_._1_7_,(char)error.offset_) != &error.diagnostic_) {
          operator_delete((undefined1 *)CONCAT71(error.offset_._1_7_,(char)error.offset_),
                          (ulong)(error.diagnostic_._M_dataplus._M_p + 1));
        }
        if ((long *)local_300.data_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_300.data_.data_ + 8))();
        }
        if (pbStack_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_308,pbStack_308);
        }
      }
      pCVar2 = result.paths.
               super__Vector_base<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>,_std::allocator<std::unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
               super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ._M_t.
               super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl;
      local_300.data_.data_ = (uchar *)CONCAT44(local_300.data_.data_._4_4_,3);
      local_310 = (undefined1  [8])
                  ((long)*(pointer *)
                          ((long)&(pCVar2->certs).
                                  super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                          + 8) -
                   *(long *)&(pCVar2->certs).
                             super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  >> 4);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&error,"3U","path1.certs.size()",(uint *)&local_300,
                 (unsigned_long *)local_310);
      if ((char)error.offset_ != '\0') {
        if (error._8_8_ != 0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&error.code_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error._8_8_);
        }
        testing::internal::
        CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                  ((internal *)&error,"target_","path1.certs[0]",lhs,
                   *(shared_ptr<const_bssl::ParsedCertificate> **)
                    &(pCVar2->certs).
                     super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  );
        if ((char)error.offset_ == '\0') {
          testing::Message::Message((Message *)local_310);
          if (error._8_8_ == 0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)error._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_300,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6e8,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_300,(Message *)local_310);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
          if (local_310 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_310 + 8))();
          }
        }
        if (error._8_8_ != 0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&error.code_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error._8_8_);
        }
        testing::internal::
        CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                  ((internal *)&error,"newintermediate_","path1.certs[1]",
                   &(this->super_PathBuilderKeyRolloverTest).newintermediate_,
                   (shared_ptr<const_bssl::ParsedCertificate> *)
                   (*(long *)&(pCVar2->certs).
                              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   + 0x10));
        if ((char)error.offset_ == '\0') {
          testing::Message::Message((Message *)local_310);
          if (error._8_8_ == 0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)error._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_300,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6e9,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_300,(Message *)local_310);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
          if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_310 !=
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            (**(code **)(*(long *)local_310 + 8))();
          }
        }
        if (error._8_8_ != 0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&error.code_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error._8_8_);
        }
        testing::internal::
        CmpHelperEQ<std::shared_ptr<bssl::ParsedCertificate_const>,std::shared_ptr<bssl::ParsedCertificate_const>>
                  ((internal *)&error,"newroot_","path1.certs[2]",lhs_00,
                   (shared_ptr<const_bssl::ParsedCertificate> *)
                   (*(long *)&(pCVar2->certs).
                              super__Vector_base<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                   + 0x20));
        if ((char)error.offset_ == '\0') {
          testing::Message::Message((Message *)local_310);
          if (error._8_8_ == 0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)error._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_300,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6ea,pcVar8);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_300,(Message *)local_310);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
          if (local_310 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_310 + 8))();
          }
        }
        if (error._8_8_ != 0) {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&error.code_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       error._8_8_);
        }
        CertPathBuilder::Result::GetBestPathVerifyError(&error,&result);
        SVar5 = VerifyError::Code(&error);
        local_300.data_.data_ = (uchar *)CONCAT44(local_300.data_.data_._4_4_,SVar5);
        local_2f0.data_._0_4_ = 0;
        testing::internal::CmpHelperEQ<bssl::VerifyError::StatusCode,bssl::VerifyError::StatusCode>
                  ((internal *)local_310,"error.Code()","VerifyError::StatusCode::PATH_VERIFIED",
                   (StatusCode *)&local_300,(StatusCode *)&local_2f0);
        if (local_310[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_300);
          psVar6 = VerifyError::DiagnosticString_abi_cxx11_(&error);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)((long)local_300.data_.data_ + 0x10),(psVar6->_M_dataplus)._M_p,
                     psVar6->_M_string_length);
          if (pbStack_308 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = (pbStack_308->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_2f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                     ,0x6ed,pcVar8);
          testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
          testing::internal::AssertHelper::~AssertHelper(&local_2f0);
          if ((long *)local_300.data_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_300.data_.data_ + 8))();
          }
        }
        if (pbStack_308 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          ::std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_308,pbStack_308);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error.diagnostic_._M_dataplus._M_p != &error.diagnostic_.field_2) {
          operator_delete(error.diagnostic_._M_dataplus._M_p,
                          error.diagnostic_.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0036c25c;
      }
      testing::Message::Message((Message *)local_310);
      if (error._8_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)error._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_300,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
                 ,0x6e7,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_310);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
  if (local_310 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_310 + 8))();
  }
  if (error._8_8_ != 0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&error.code_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error._8_8_);
  }
LAB_0036c25c:
  CertPathBuilder::Result::~Result(&result);
  CertPathBuilder::~CertPathBuilder(&path_builder);
  AsyncCertIssuerSourceStatic::~AsyncCertIssuerSourceStatic(&async_certs);
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&sync_certs2);
  CertIssuerSourceStatic::~CertIssuerSourceStatic(&sync_certs1);
  TrustStoreInMemory::~TrustStoreInMemory(&trust_store);
  if (oldintermediate_dupe.
      super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (oldintermediate_dupe.
               super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST_F(PathBuilderKeyRolloverTest, TestDuplicateIntermediates) {
  // Create a separate copy of oldintermediate.
  std::shared_ptr<const ParsedCertificate> oldintermediate_dupe(
      ParsedCertificate::Create(
          bssl::UniquePtr<CRYPTO_BUFFER>(
              CRYPTO_BUFFER_new(oldintermediate_->der_cert().data(),
                                oldintermediate_->der_cert().size(), nullptr)),
          {}, nullptr));

  // Only newroot is a trusted root.
  TrustStoreInMemory trust_store;
  trust_store.AddTrustAnchor(newroot_);

  // The oldintermediate is supplied synchronously by |sync_certs1| and
  // another copy of oldintermediate is supplied synchronously by |sync_certs2|.
  // The path target <- oldintermediate <- newroot  should be built first,
  // though it won't verify. It should not be attempted again even though
  // oldintermediate was supplied twice.
  CertIssuerSourceStatic sync_certs1;
  sync_certs1.AddCert(oldintermediate_);
  CertIssuerSourceStatic sync_certs2;
  sync_certs2.AddCert(oldintermediate_dupe);

  // The newintermediate is supplied asynchronously, so the path
  // target <- newintermediate <- newroot should be tried second.
  AsyncCertIssuerSourceStatic async_certs;
  async_certs.AddCert(newintermediate_);

  CertPathBuilder path_builder(
      target_, &trust_store, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);
  path_builder.AddCertIssuerSource(&sync_certs1);
  path_builder.AddCertIssuerSource(&sync_certs2);
  path_builder.AddCertIssuerSource(&async_certs);

  auto result = path_builder.Run();

  EXPECT_TRUE(result.HasValidPath());
  ASSERT_EQ(2U, result.paths.size());

  // Path builder will first attempt: target <- oldintermediate <- newroot
  // but it will fail since oldintermediate is signed by oldroot.
  EXPECT_FALSE(result.paths[0]->IsValid());
  const auto &path0 = *result.paths[0];

  ASSERT_EQ(3U, path0.certs.size());
  EXPECT_EQ(target_, path0.certs[0]);
  // Compare the DER instead of ParsedCertificate pointer, don't care which copy
  // of oldintermediate was used in the path.
  EXPECT_EQ(oldintermediate_->der_cert(), path0.certs[1]->der_cert());
  EXPECT_EQ(newroot_, path0.certs[2]);

  // Path builder will next attempt: target <- newintermediate <- newroot
  // which will succeed.
  EXPECT_EQ(1U, result.best_result_index);
  EXPECT_TRUE(result.paths[1]->IsValid());
  const auto &path1 = *result.paths[1];
  ASSERT_EQ(3U, path1.certs.size());
  EXPECT_EQ(target_, path1.certs[0]);
  EXPECT_EQ(newintermediate_, path1.certs[1]);
  EXPECT_EQ(newroot_, path1.certs[2]);

  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_VERIFIED)
      << error.DiagnosticString();
}